

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O2

void test_open_address_dictionary_cursor_range(planck_unit_test_t *tc)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  ion_cursor_status_t iVar3;
  int iVar4;
  char *__s;
  int iVar5;
  ion_dict_cursor_t *cursor;
  ion_record_t record;
  ion_record_info_t record_info;
  ion_dictionary_t test_dictionary;
  ion_predicate_t predicate;
  ion_dictionary_handler_t map_handler;
  
  record_info.key_size = 4;
  record_info.value_size = 10;
  createTestDictionary(&map_handler,&record_info,10,&test_dictionary,key_type_numeric_signed);
  dictionary_build_predicate(&predicate,'\x01');
  iVar1 = dictionary_find(&test_dictionary,&predicate,&cursor);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\0'),0x1ed,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 != '\0') {
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(cursor->status == '\x02'),0x1f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar2 != '\0') {
      record.value = malloc(10);
      record.key = malloc(4);
      iVar5 = 0;
      while( true ) {
        iVar3 = (*cursor->next)(cursor,&record);
        if (iVar3 != '\x04') break;
        pVar2 = planck_unit_assert_true
                          (tc,1,0x1fc,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                           ,"condition was false, expected true");
        if (pVar2 == '\0') goto LAB_00104959;
        __s = (char *)malloc(10);
        sprintf(__s,"value : %i",(ulong)(uint)(*predicate.statement.range.lower_bound + iVar5));
        iVar4 = bcmp(record.value,__s,10);
        pVar2 = planck_unit_assert_true
                          (tc,(uint)(iVar4 == 0),0x204,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                           ,"condition was false, expected true");
        if (pVar2 == '\0') goto LAB_00104959;
        pVar2 = planck_unit_assert_true
                          (tc,(uint)(*(cursor->predicate->statement).range.lower_bound <=
                                    *record.key),0x205,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                           ,"condition was false, expected true");
        if (pVar2 == '\0') goto LAB_00104959;
        pVar2 = planck_unit_assert_true
                          (tc,(uint)(*record.key <=
                                    *(cursor->predicate->statement).range.upper_bound),0x206,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                           ,"condition was false, expected true");
        if (pVar2 == '\0') goto LAB_00104959;
        iVar5 = iVar5 + 1;
        free(__s);
      }
      pVar2 = planck_unit_assert_true
                        (tc,(uint)(iVar5 == 5),0x20b,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                         ,"condition was false, expected true");
      if (pVar2 != '\0') {
        iVar3 = (*cursor->next)(cursor,&record);
        pVar2 = planck_unit_assert_true
                          (tc,(uint)(iVar3 == '\x01'),0x20e,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                           ,"condition was false, expected true");
        if (pVar2 != '\0') {
          (*cursor->destroy)(&cursor);
          pVar2 = planck_unit_assert_true
                            (tc,(uint)(cursor == (ion_dict_cursor_t *)0x0),0x214,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                             ,"condition was false, expected true");
          if (pVar2 != '\0') {
            free(record.key);
            free(record.value);
            dictionary_delete_dictionary(&test_dictionary);
            return;
          }
        }
      }
    }
  }
LAB_00104959:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_dictionary_cursor_range(
	planck_unit_test_t *tc
) {
	int					size;
	ion_record_info_t	record_info;

	/* this is required for initializing the hash map and should come from the dictionary */
	record_info.key_size	= sizeof(int);
	record_info.value_size	= 10;
	size					= 10;

	ion_dictionary_handler_t	map_handler;			/* create handler for hashmap */
	ion_dictionary_t			test_dictionary;		/* dictionary handler for test instance */

	createTestDictionary(&map_handler, &record_info, size, &test_dictionary, key_type_numeric_signed);

	ion_dict_cursor_t *cursor;	/* create a new cursor */

	/* create a new predicate statement */
	ion_predicate_t predicate;

	dictionary_build_predicate(&predicate, predicate_range, IONIZE(1, int), IONIZE(5, int));
	/* test that the query runs on dictionary instance okay */
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == dictionary_find(&test_dictionary, &predicate, &cursor));

	/* check the status of the cursor as it should be initialized */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_initialized == cursor->status);

	/* user must allocate memory before calling next() */
	ion_record_t record;

	record.value	= malloc(record_info.value_size);
	record.key		= malloc(record_info.key_size);

	int					result_count = 0;
	ion_cursor_status_t cursor_status;

	while (cs_cursor_active == (cursor_status = cursor->next(cursor, &record))) {
		PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_active == cursor_status);

		/* check that value is correct that has been returned */
		ion_value_t str;

		str = malloc(record_info.value_size);
		sprintf((char *) str, "value : %i", (*(int *) predicate.statement.range.lower_bound) + result_count);

		PLANCK_UNIT_ASSERT_TRUE(tc, ION_IS_EQUAL == memcmp(record.value, str, record_info.value_size));
		PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) (record.key) >= *(int *) (cursor->predicate->statement.range.lower_bound));
		PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) (record.key) <= *(int *) (cursor->predicate->statement.range.upper_bound));
		result_count++;
		free(str);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, 5 == result_count);

	/* and as there is only 1 result, the next call should return empty */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_end_of_results == cursor->next(cursor, &record));

	/* destroy the cursor */
	cursor->destroy(&cursor);

	/* and check that cursor has been destroyed correctly */
	PLANCK_UNIT_ASSERT_TRUE(tc, NULL == cursor);

	free(record.key);
	free(record.value);

	/* and destroy the dictionary instance */
	dictionary_delete_dictionary(&test_dictionary);
}